

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quasiquote_conversion.cpp
# Opt level: O3

Expression * __thiscall
skiwi::anon_unknown_26::quasiquote_conversion_visitor::cell_to_expression
          (Expression *__return_storage_ptr__,quasiquote_conversion_visitor *this,cell *c,
          bool as_list)

{
  Expression *pEVar1;
  undefined4 extraout_EDX;
  undefined4 extraout_var;
  vector<skiwi::token,_std::allocator<skiwi::token>_> tokens;
  Expression expr;
  stringstream str;
  vector<skiwi::token,_std::allocator<skiwi::token>_> local_2a8;
  undefined1 local_290 [240];
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  operator<<(local_190,(cell *)this);
  std::__cxx11::stringbuf::str();
  tokenize(&local_2a8,(string *)local_290);
  if ((undefined1 *)local_290._0_8_ != local_290 + 0x10) {
    operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
  }
  std::
  __reverse<__gnu_cxx::__normal_iterator<skiwi::token*,std::vector<skiwi::token,std::allocator<skiwi::token>>>>
            (local_2a8.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_2a8.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
             super__Vector_impl_data._M_finish);
  make_expression((Expression *)local_290,&local_2a8);
  if ((char)c == '\0') {
    std::__detail::__variant::
    _Move_ctor_base<false,_skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
    ::_Move_ctor_base((_Move_ctor_base<false,_skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                       *)__return_storage_ptr__,
                      (_Move_ctor_base<false,_skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                       *)local_290);
  }
  else {
    make_list(__return_storage_ptr__,(quasiquote_conversion_visitor *)local_290,
              (Expression *)CONCAT44(extraout_var,extraout_EDX));
  }
  std::__detail::__variant::
  _Variant_storage<false,_skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
  ::~_Variant_storage((_Variant_storage<false,_skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                       *)local_290);
  std::vector<skiwi::token,_std::allocator<skiwi::token>_>::~vector(&local_2a8);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  pEVar1 = (Expression *)std::ios_base::~ios_base(local_120);
  return pEVar1;
}

Assistant:

Expression cell_to_expression(const cell& c, bool as_list)
      {
      std::stringstream str;
      str << c;
      auto tokens = tokenize(str.str());
      std::reverse(tokens.begin(), tokens.end());
      auto expr = make_expression(tokens);
      if (!as_list)
        return expr;
      return make_list(expr);
      }